

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcMapping.c
# Opt level: O1

void Sparc_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  unsigned_short uVar6;
  uint uVar7;
  long lVar8;
  
  uVar6 = insn_find(insns,0x1b9,id,&h->insn_cache);
  if (uVar6 != 0) {
    insn->id = (uint)insns[uVar6].mapid;
    if (h->detail != CS_OPT_OFF) {
      pcVar2 = insn->detail;
      *(undefined8 *)(pcVar2->regs_read + 8) = *(undefined8 *)(insns[uVar6].regs_use + 8);
      uVar3 = *(undefined8 *)(insns[uVar6].regs_use + 4);
      *(undefined8 *)pcVar2->regs_read = *(undefined8 *)insns[uVar6].regs_use;
      *(undefined8 *)(pcVar2->regs_read + 4) = uVar3;
      uVar7 = count_positive(insns[uVar6].regs_use);
      pcVar2 = insn->detail;
      pcVar2->regs_read_count = (uint8_t)uVar7;
      *(undefined8 *)(pcVar2->regs_write + 0x10) = *(undefined8 *)(insns[uVar6].regs_mod + 0x10);
      uVar3 = *(undefined8 *)insns[uVar6].regs_mod;
      uVar4 = *(undefined8 *)(insns[uVar6].regs_mod + 4);
      uVar5 = *(undefined8 *)(insns[uVar6].regs_mod + 0xc);
      *(undefined8 *)(pcVar2->regs_write + 8) = *(undefined8 *)(insns[uVar6].regs_mod + 8);
      *(undefined8 *)(pcVar2->regs_write + 0xc) = uVar5;
      *(undefined8 *)pcVar2->regs_write = uVar3;
      *(undefined8 *)(pcVar2->regs_write + 4) = uVar4;
      uVar7 = count_positive(insns[uVar6].regs_mod);
      pcVar2 = insn->detail;
      pcVar2->regs_write_count = (uint8_t)uVar7;
      *(undefined8 *)pcVar2->groups = *(undefined8 *)insns[uVar6].groups;
      uVar7 = count_positive8(insns[uVar6].groups);
      pcVar2 = insn->detail;
      pcVar2->groups_count = (uint8_t)uVar7;
      if ((insns[uVar6].branch != false) || (insns[uVar6].indirect_branch == true)) {
        pcVar2->groups[uVar7 & 0xff] = '\x01';
        puVar1 = &insn->detail->groups_count;
        *puVar1 = *puVar1 + '\x01';
      }
      lVar8 = 0;
      do {
        if (insn_hints[lVar8].id == id) {
          *(uint *)((long)&insn->detail->field_6 + 4) = (uint)insn_hints[lVar8].hints;
          return;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x12);
    }
  }
  return;
}

Assistant:

void Sparc_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	unsigned short i;

	i = insn_find(insns, ARR_SIZE(insns), id, &h->insn_cache);
	if (i != 0) {
		insn->id = insns[i].mapid;

		if (h->detail) {
#ifndef CAPSTONE_DIET
			memcpy(insn->detail->regs_read, insns[i].regs_use, sizeof(insns[i].regs_use));
			insn->detail->regs_read_count = (uint8_t)count_positive(insns[i].regs_use);

			memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
			insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);

			memcpy(insn->detail->groups, insns[i].groups, sizeof(insns[i].groups));
			insn->detail->groups_count = (uint8_t)count_positive8(insns[i].groups);

			if (insns[i].branch || insns[i].indirect_branch) {
				// this insn also belongs to JUMP group. add JUMP group
				insn->detail->groups[insn->detail->groups_count] = SPARC_GRP_JUMP;
				insn->detail->groups_count++;
			}
#endif
			// hint code
			for (i = 0; i < ARR_SIZE(insn_hints); i++) {
				if (id == insn_hints[i].id) {
					insn->detail->sparc.hint = insn_hints[i].hints;
					break;
				}
			}
		}
	}
}